

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::LoadFileIntoMemory(MD5Importer *this,IOStream *file)

{
  uint uVar1;
  char *pcVar2;
  IOStream *file_local;
  MD5Importer *this_local;
  
  UnloadFileFromMemory(this);
  if (file == (IOStream *)0x0) {
    __assert_fail("__null != file",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                  ,0xca,"void Assimp::MD5Importer::LoadFileIntoMemory(IOStream *)");
  }
  uVar1 = (*file->_vptr_IOStream[6])();
  this->fileSize = uVar1;
  if (this->fileSize != 0) {
    pcVar2 = (char *)operator_new__((ulong)(this->fileSize + 1));
    this->mBuffer = pcVar2;
    (*file->_vptr_IOStream[2])(file,this->mBuffer,1,(ulong)this->fileSize);
    this->iLineNumber = 1;
    this->mBuffer[this->fileSize] = '\0';
    CommentRemover::RemoveLineComments("//",this->mBuffer,' ');
    return;
  }
  __assert_fail("fileSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                ,0xcc,"void Assimp::MD5Importer::LoadFileIntoMemory(IOStream *)");
}

Assistant:

void MD5Importer::LoadFileIntoMemory (IOStream* file)
{
    // unload the previous buffer, if any
    UnloadFileFromMemory();

    ai_assert(NULL != file);
    fileSize = (unsigned int)file->FileSize();
    ai_assert(fileSize);

    // allocate storage and copy the contents of the file to a memory buffer
    mBuffer = new char[fileSize+1];
    file->Read( (void*)mBuffer, 1, fileSize);
    iLineNumber = 1;

    // append a terminal 0
    mBuffer[fileSize] = '\0';

    // now remove all line comments from the file
    CommentRemover::RemoveLineComments("//",mBuffer,' ');
}